

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O1

char * read_body(BinarySource *src)

{
  bool bVar1;
  uchar uVar2;
  strbuf *buf_o;
  char *unaff_R12;
  
  buf_o = strbuf_new_nm();
  do {
    uVar2 = BinarySource_get_byte(src->binarysource_);
    if (((uVar2 == '\n') || (uVar2 == '\r')) || (src->binarysource_->err != BSE_NO_ERROR)) {
      if (src->binarysource_->err == BSE_NO_ERROR) {
        uVar2 = BinarySource_get_byte(src->binarysource_);
        if (((uVar2 != '\n') && (uVar2 != '\r')) && (src->binarysource_->err == BSE_NO_ERROR)) {
          src->pos = src->pos - 1;
        }
      }
      unaff_R12 = strbuf_to_str(buf_o);
      bVar1 = false;
    }
    else {
      BinarySink_put_byte(buf_o->binarysink_,uVar2);
      bVar1 = true;
    }
  } while (bVar1);
  return unaff_R12;
}

Assistant:

static char *read_body(BinarySource *src)
{
    strbuf *buf = strbuf_new_nm();

    while (1) {
        int c = get_byte(src);
        if (c == '\r' || c == '\n' || get_err(src)) {
            if (!get_err(src)) {
                c = get_byte(src);
                if (c != '\r' && c != '\n' && !get_err(src))
                    src->pos--;
            }
            return strbuf_to_str(buf);
        }
        put_byte(buf, c);
    }
}